

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O1

TString * luaS_new(lua_State *L,char *str)

{
  undefined8 *puVar1;
  int iVar2;
  size_t l;
  TString *pTVar3;
  long lVar4;
  
  iVar2 = (int)(((ulong)str & 0xffffffff) * 0x3521cfb3 >> 0x20);
  puVar1 = (undefined8 *)
           ((long)L->l_G->strcache[0] +
           (ulong)(((int)str + (((uint)((int)str - iVar2) >> 1) + iVar2 >> 5) * -0x35) * 0x10));
  lVar4 = 0;
  do {
    pTVar3 = (TString *)puVar1[lVar4];
    iVar2 = strcmp(str,(char *)(pTVar3 + 1));
    if (iVar2 == 0) {
      return pTVar3;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 == 1);
  puVar1[1] = *puVar1;
  l = strlen(str);
  pTVar3 = luaS_newlstr(L,str,l);
  *puVar1 = pTVar3;
  return pTVar3;
}

Assistant:

TString *luaS_new (lua_State *L, const char *str) {
  unsigned int i = point2uint(str) % STRCACHE_N;  /* hash */
  int j;
  TString **p = G(L)->strcache[i];
  for (j = 0; j < STRCACHE_M; j++) {
    if (strcmp(str, getstr(p[j])) == 0)  /* hit? */
      return p[j];  /* that is it */
  }
  /* normal route */
  for (j = STRCACHE_M - 1; j > 0; j--)
    p[j] = p[j - 1];  /* move out last element */
  /* new element is first in the list */
  p[0] = luaS_newlstr(L, str, strlen(str));
  return p[0];
}